

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  StringPtr *pSVar1;
  size_t newSize;
  InsertionOrderIndex local_28;
  
  InsertionOrderIndex::insertImpl(&local_28,(size_t)(this + 0x20));
  if ((char)local_28.capacity != '\x01') {
    pSVar1 = *(StringPtr **)(this + 8);
    if (pSVar1 == *(StringPtr **)(this + 0x10)) {
      newSize = 4;
      if (pSVar1 != *(StringPtr **)this) {
        newSize = (long)pSVar1 - (long)*(StringPtr **)this >> 1;
      }
      Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
      pSVar1 = *(StringPtr **)(this + 8);
    }
    *(undefined4 *)&(pSVar1->content).ptr = *(undefined4 *)&(row->content).ptr;
    *(undefined1 **)(this + 8) = (undefined1 *)((long)&(pSVar1->content).ptr + 4);
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}